

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffcsum(fitsfile *fptr,long nrec,unsigned_long *sum,int *status)

{
  ulong local_ba8;
  unsigned_long locarry;
  unsigned_long hicarry;
  unsigned_long lo;
  unsigned_long hi;
  unsigned_short sbuf [1440];
  long local_40;
  long jj;
  long ii;
  int *status_local;
  unsigned_long *sum_local;
  long nrec_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    for (local_40 = 0; local_40 < nrec; local_40 = local_40 + 1) {
      ffgbyt(fptr,0xb40,&hi,status);
      ffswap2((short *)&hi,0x5a0);
      lo = *sum >> 0x10;
      hicarry = *sum & 0xffff;
      for (jj = 0; jj < 0x5a0; jj = jj + 2) {
        lo = sbuf[jj + -4] + lo;
        hicarry = sbuf[jj + -3] + hicarry;
      }
      while( true ) {
        locarry = lo >> 0x10;
        local_ba8 = hicarry >> 0x10;
        if (locarry == 0 && local_ba8 == 0) break;
        lo = (lo & 0xffff) + local_ba8;
        hicarry = (hicarry & 0xffff) + locarry;
      }
      *sum = lo * 0x10000 + hicarry;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffcsum(fitsfile *fptr,      /* I - FITS file pointer                  */
           long nrec,           /* I - number of 2880-byte blocks to sum  */
           unsigned long *sum,  /* IO - accumulated checksum              */
           int *status)         /* IO - error status                      */
/*
    Calculate a 32-bit 1's complement checksum of the FITS 2880-byte blocks.
    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,  
    published in the Astronomical Society of the Pacific Conference Series.
    This uses a 32-bit 1's complement checksum in which the overflow bits
    are permuted back into the sum and therefore all bit positions are
    sampled evenly. 
*/
{
    long ii, jj;
    unsigned short sbuf[1440];
    unsigned long hi, lo, hicarry, locarry;

    if (*status > 0)
        return(*status);
  /*
    Sum the specified number of FITS 2880-byte records.  This assumes that
    the FITSIO file pointer points to the start of the records to be summed.
    Read each FITS block as 1440 short values (do byte swapping if needed).
  */
    for (jj = 0; jj < nrec; jj++)
    {
      ffgbyt(fptr, 2880, sbuf, status);

#if BYTESWAPPED

      ffswap2( (short *)sbuf, 1440); /* reverse order of bytes in each value */

#endif

      hi = (*sum >> 16);
      lo = *sum & 0xFFFF;

      for (ii = 0; ii < 1440; ii += 2)
      {
        hi += sbuf[ii];
        lo += sbuf[ii+1];
      }

      hicarry = hi >> 16;    /* fold carry bits in */
      locarry = lo >> 16;

      while (hicarry | locarry)
      {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
      }

      *sum = (hi << 16) + lo;
    }
    return(*status);
}